

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseGraph.cpp
# Opt level: O1

void PrintGraph(ParseGraphContext *ctx,SynBase *syntax,char *name)

{
  long lVar1;
  _func_int **pp_Var2;
  undefined8 uVar3;
  char *pcVar4;
  OutputContext *pOVar5;
  SynBase *pSVar6;
  uint uVar7;
  ulong uVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  SynBase *pSVar12;
  
  if (0x400 < ctx->depth) {
    pcVar9 = "{...}";
    goto LAB_001d31b1;
  }
  if (syntax == (SynBase *)0x0) {
LAB_001d31ff:
    pSVar6 = (SynBase *)0x0;
  }
  else {
    if (syntax->typeID == 0) {
      pcVar9 = "SynError()";
      goto LAB_001d31b1;
    }
    if (syntax == (SynBase *)0x0) goto LAB_001d31ff;
    if (syntax->typeID == 3) {
      pcVar9 = "SynNothing()";
      goto LAB_001d31b1;
    }
    if ((syntax == (SynBase *)0x0) || (pSVar6 = syntax, syntax->typeID != 4)) goto LAB_001d31ff;
  }
  if (pSVar6 != (SynBase *)0x0) {
    uVar8 = (ulong)(pSVar6[1].typeID - (int)pSVar6[1]._vptr_SynBase);
    pcVar9 = "SynIdentifier(%.*s)";
    goto LAB_001d3217;
  }
  if (syntax == (SynBase *)0x0) {
LAB_001d326b:
    pSVar6 = (SynBase *)0x0;
  }
  else {
    if (syntax->typeID == 5) {
      pcVar9 = "SynTypeAuto()";
      goto LAB_001d31b1;
    }
    if (syntax == (SynBase *)0x0) goto LAB_001d326b;
    if (syntax->typeID == 6) {
      pcVar9 = "SynTypeGeneric()";
      goto LAB_001d31b1;
    }
    if ((syntax == (SynBase *)0x0) || (pSVar6 = syntax, syntax->typeID != 7)) goto LAB_001d326b;
  }
  if (pSVar6 != (SynBase *)0x0) {
    PrintEnterBlock(ctx,name,"SynTypeSimple(%.*s)",
                    (ulong)(uint)(*(int *)&pSVar6[1].end - (int)pSVar6[1].begin));
    pSVar6 = (SynBase *)pSVar6[1]._vptr_SynBase;
    while (pSVar6 != (SynBase *)0x0) {
      PrintGraph(ctx,pSVar6,"");
      pSVar6 = pSVar6->next;
      if ((pSVar6 == (SynBase *)0x0) || (pSVar6->typeID != 4)) {
        pSVar6 = (SynBase *)0x0;
      }
    }
    goto LAB_001d33ba;
  }
  if ((syntax == (SynBase *)0x0) || (pSVar6 = syntax, syntax->typeID != 8)) {
    pSVar6 = (SynBase *)0x0;
  }
  if (pSVar6 != (SynBase *)0x0) {
    uVar8 = (ulong)(uint)(*(int *)(pSVar6[1]._vptr_SynBase + 9) - (int)pSVar6[1]._vptr_SynBase[8]);
    pcVar9 = "SynTypeAlias(%.*s)";
    goto LAB_001d3217;
  }
  if ((syntax == (SynBase *)0x0) || (pSVar6 = syntax, syntax->typeID != 9)) {
    pSVar6 = (SynBase *)0x0;
  }
  if (pSVar6 != (SynBase *)0x0) {
    PrintEnterBlock(ctx,name,"SynTypeArray()");
    PrintGraph(ctx,(SynBase *)pSVar6[1]._vptr_SynBase,"type");
    PrintEnterBlock(ctx,"sizes");
    for (pSVar6 = *(SynBase **)&pSVar6[1].typeID; pSVar6 != (SynBase *)0x0; pSVar6 = pSVar6->next) {
      PrintGraph(ctx,pSVar6,"");
    }
    goto LAB_001d3373;
  }
  if ((syntax == (SynBase *)0x0) || (pSVar6 = syntax, syntax->typeID != 10)) {
    pSVar6 = (SynBase *)0x0;
  }
  if (pSVar6 == (SynBase *)0x0) {
    if ((syntax == (SynBase *)0x0) || (pSVar6 = syntax, syntax->typeID != 0xb)) {
      pSVar6 = (SynBase *)0x0;
    }
    if (pSVar6 == (SynBase *)0x0) {
      if ((syntax == (SynBase *)0x0) || (pSVar6 = syntax, syntax->typeID != 0xc)) {
        pSVar6 = (SynBase *)0x0;
      }
      if (pSVar6 == (SynBase *)0x0) {
        if ((syntax == (SynBase *)0x0) || (pSVar6 = syntax, syntax->typeID != 0xd)) {
          pSVar6 = (SynBase *)0x0;
        }
        if (pSVar6 != (SynBase *)0x0) {
          pcVar9 = "SynTypeof()";
          goto LAB_001d34e2;
        }
        if ((syntax == (SynBase *)0x0) || (pSVar6 = syntax, syntax->typeID != 0xe)) {
          pSVar6 = (SynBase *)0x0;
        }
        if (pSVar6 != (SynBase *)0x0) {
          pcVar9 = "false";
          if (pSVar6->field_0x3a != '\0') {
            pcVar9 = "true";
          }
          PrintIndented(ctx,name,"SynBool(%s)",pcVar9);
          return;
        }
        if ((syntax == (SynBase *)0x0) || (pSVar6 = syntax, syntax->typeID != 0xf)) {
          pSVar6 = (SynBase *)0x0;
        }
        if (pSVar6 != (SynBase *)0x0) {
          uVar8 = (ulong)(pSVar6[1].typeID - (int)pSVar6[1]._vptr_SynBase);
          pcVar9 = "SynNumber(%.*s)";
          goto LAB_001d3217;
        }
        if (syntax == (SynBase *)0x0) {
LAB_001d3599:
          pSVar6 = (SynBase *)0x0;
        }
        else {
          if (syntax->typeID == 0x10) {
            pcVar9 = "SynNullptr()";
            goto LAB_001d31b1;
          }
          if ((syntax == (SynBase *)0x0) || (pSVar6 = syntax, syntax->typeID != 0x11))
          goto LAB_001d3599;
        }
        if (pSVar6 != (SynBase *)0x0) {
          uVar8 = (ulong)(pSVar6[1].typeID - (int)pSVar6[1]._vptr_SynBase);
          pcVar9 = "SynCharacter(%.*s)";
LAB_001d3217:
          PrintIndented(ctx,name,pcVar9,uVar8);
          return;
        }
        if ((syntax == (SynBase *)0x0) || (pSVar6 = syntax, syntax->typeID != 0x12)) {
          pSVar6 = (SynBase *)0x0;
        }
        if (pSVar6 != (SynBase *)0x0) {
          uVar8 = (ulong)(pSVar6[1].typeID - (int)pSVar6[1]._vptr_SynBase);
          pcVar9 = "SynString(%.*s)";
          goto LAB_001d3217;
        }
        if ((syntax == (SynBase *)0x0) || (pSVar6 = syntax, syntax->typeID != 0x13)) {
          pSVar6 = (SynBase *)0x0;
        }
        if (pSVar6 != (SynBase *)0x0) {
          PrintEnterBlock(ctx,name,"SynArray()");
          for (pSVar6 = (SynBase *)pSVar6[1]._vptr_SynBase; pSVar6 != (SynBase *)0x0;
              pSVar6 = pSVar6->next) {
            PrintGraph(ctx,pSVar6,"");
          }
          goto LAB_001d33ba;
        }
        if ((syntax == (SynBase *)0x0) || (pSVar6 = syntax, syntax->typeID != 0x14)) {
          pSVar6 = (SynBase *)0x0;
        }
        if (pSVar6 != (SynBase *)0x0) {
          PrintEnterBlock(ctx,name,"SynGenerator()");
          for (pSVar6 = (SynBase *)pSVar6[1]._vptr_SynBase; pSVar6 != (SynBase *)0x0;
              pSVar6 = pSVar6->next) {
            PrintGraph(ctx,pSVar6,"");
          }
          goto LAB_001d33ba;
        }
        if ((syntax == (SynBase *)0x0) || (pSVar6 = syntax, syntax->typeID != 0x15)) {
          pSVar6 = (SynBase *)0x0;
        }
        if (pSVar6 != (SynBase *)0x0) {
          pcVar9 = "SynAlign()";
          goto LAB_001d34e2;
        }
        if ((syntax == (SynBase *)0x0) || (pSVar6 = syntax, syntax->typeID != 0x16)) {
          pSVar6 = (SynBase *)0x0;
        }
        if (pSVar6 != (SynBase *)0x0) {
          uVar7 = *(int *)(*(long *)&pSVar6[1].typeID + 0x48) -
                  (int)*(undefined8 *)(*(long *)&pSVar6[1].typeID + 0x40);
          pcVar9 = "SynTypedef(%.*s)";
LAB_001d36e2:
          PrintEnterBlock(ctx,name,pcVar9,(ulong)uVar7);
          goto LAB_001d33a7;
        }
        if ((syntax == (SynBase *)0x0) || (pSVar6 = syntax, syntax->typeID != 0x17)) {
          pSVar6 = (SynBase *)0x0;
        }
        if (pSVar6 == (SynBase *)0x0) {
          if ((syntax == (SynBase *)0x0) || (pSVar6 = syntax, syntax->typeID != 0x18)) {
            pSVar6 = (SynBase *)0x0;
          }
          if (pSVar6 == (SynBase *)0x0) {
            if ((syntax == (SynBase *)0x0) || (pSVar6 = syntax, syntax->typeID != 0x19)) {
              pSVar6 = (SynBase *)0x0;
            }
            if (pSVar6 == (SynBase *)0x0) {
              if ((syntax == (SynBase *)0x0) || (pSVar6 = syntax, syntax->typeID != 0x1a)) {
                pSVar6 = (SynBase *)0x0;
              }
              if (pSVar6 == (SynBase *)0x0) {
                if ((syntax == (SynBase *)0x0) || (pSVar6 = syntax, syntax->typeID != 0x1b)) {
                  pSVar6 = (SynBase *)0x0;
                }
                if (pSVar6 == (SynBase *)0x0) {
                  if ((syntax == (SynBase *)0x0) || (pSVar6 = syntax, syntax->typeID != 0x1c)) {
                    pSVar6 = (SynBase *)0x0;
                  }
                  if (pSVar6 == (SynBase *)0x0) {
                    if ((syntax == (SynBase *)0x0) || (pSVar6 = syntax, syntax->typeID != 0x1d)) {
                      pSVar6 = (SynBase *)0x0;
                    }
                    if (pSVar6 == (SynBase *)0x0) {
                      if ((syntax == (SynBase *)0x0) || (pSVar6 = syntax, syntax->typeID != 0x1e)) {
                        pSVar6 = (SynBase *)0x0;
                      }
                      if (pSVar6 == (SynBase *)0x0) {
                        if ((syntax == (SynBase *)0x0) || (pSVar6 = syntax, syntax->typeID != 0x1f))
                        {
                          pSVar6 = (SynBase *)0x0;
                        }
                        if (pSVar6 == (SynBase *)0x0) {
                          if ((syntax == (SynBase *)0x0) ||
                             (pSVar6 = syntax, syntax->typeID != 0x20)) {
                            pSVar6 = (SynBase *)0x0;
                          }
                          if (pSVar6 != (SynBase *)0x0) {
                            PrintEnterBlock(ctx,name,"SynNew()");
                            PrintGraph(ctx,(SynBase *)pSVar6[1]._vptr_SynBase,"type");
                            PrintEnterBlock(ctx,"arguments");
                            for (pSVar12 = *(SynBase **)&pSVar6[1].typeID; pSVar12 != (SynBase *)0x0
                                ; pSVar12 = pSVar12->next) {
                              PrintGraph(ctx,pSVar12,"");
                            }
                            PrintLeaveBlock(ctx);
                            PrintGraph(ctx,(SynBase *)pSVar6[1].end,"count");
                            PrintEnterBlock(ctx,"constructor");
                            for (pSVar6 = (SynBase *)pSVar6[1].pos.begin; pSVar6 != (SynBase *)0x0;
                                pSVar6 = pSVar6->next) {
                              PrintGraph(ctx,pSVar6,"");
                            }
                            goto LAB_001d3373;
                          }
                          if ((syntax == (SynBase *)0x0) ||
                             (pSVar6 = syntax, syntax->typeID != 0x21)) {
                            pSVar6 = (SynBase *)0x0;
                          }
                          if (pSVar6 != (SynBase *)0x0) {
                            pcVar9 = "SynConditional()";
LAB_001d3aba:
                            PrintEnterBlock(ctx,name,pcVar9);
                            PrintGraph(ctx,(SynBase *)pSVar6[1]._vptr_SynBase,"condition");
                            PrintGraph(ctx,*(SynBase **)&pSVar6[1].typeID,"trueBlock");
                            pSVar6 = (SynBase *)pSVar6[1].begin;
                            pcVar9 = "falseBlock";
                            goto LAB_001d33b2;
                          }
                          if ((syntax == (SynBase *)0x0) ||
                             (pSVar6 = syntax, syntax->typeID != 0x22)) {
                            pSVar6 = (SynBase *)0x0;
                          }
                          if (pSVar6 == (SynBase *)0x0) {
                            if ((syntax == (SynBase *)0x0) ||
                               (pSVar6 = syntax, syntax->typeID != 0x23)) {
                              pSVar6 = (SynBase *)0x0;
                            }
                            if (pSVar6 == (SynBase *)0x0) {
                              if ((syntax == (SynBase *)0x0) ||
                                 (pSVar6 = syntax, syntax->typeID != 0x24)) {
                                pSVar6 = (SynBase *)0x0;
                              }
                              if (pSVar6 == (SynBase *)0x0) {
                                if ((syntax == (SynBase *)0x0) ||
                                   (pSVar6 = syntax, syntax->typeID != 0x25)) {
                                  pSVar6 = (SynBase *)0x0;
                                }
                                if (pSVar6 == (SynBase *)0x0) {
                                  if ((syntax == (SynBase *)0x0) ||
                                     (pSVar6 = syntax, syntax->typeID != 0x26)) {
                                    pSVar6 = (SynBase *)0x0;
                                  }
                                  if (pSVar6 != (SynBase *)0x0) {
                                    PrintEnterBlock(ctx,name,"SynBlock()");
                                    for (pSVar6 = (SynBase *)pSVar6[1]._vptr_SynBase;
                                        pSVar6 != (SynBase *)0x0; pSVar6 = pSVar6->next) {
                                      PrintGraph(ctx,pSVar6,"");
                                    }
                                    goto LAB_001d33ba;
                                  }
                                  if ((syntax == (SynBase *)0x0) ||
                                     (pSVar6 = syntax, syntax->typeID != 0x27)) {
                                    pSVar6 = (SynBase *)0x0;
                                  }
                                  if (pSVar6 != (SynBase *)0x0) {
                                    pcVar9 = "SynIfElse()";
                                    goto LAB_001d3aba;
                                  }
                                  if ((syntax == (SynBase *)0x0) ||
                                     (pSVar6 = syntax, syntax->typeID != 0x28)) {
                                    pSVar6 = (SynBase *)0x0;
                                  }
                                  if (pSVar6 != (SynBase *)0x0) {
                                    PrintEnterBlock(ctx,name,"SynFor()");
                                    PrintGraph(ctx,(SynBase *)pSVar6[1]._vptr_SynBase,"initializer")
                                    ;
                                    PrintGraph(ctx,*(SynBase **)&pSVar6[1].typeID,"condition");
                                    PrintGraph(ctx,(SynBase *)pSVar6[1].begin,"increment");
                                    pSVar6 = (SynBase *)pSVar6[1].end;
                                    goto LAB_001d3c7d;
                                  }
                                  if ((syntax == (SynBase *)0x0) ||
                                     (pSVar6 = syntax, syntax->typeID != 0x29)) {
                                    pSVar6 = (SynBase *)0x0;
                                  }
                                  if (pSVar6 != (SynBase *)0x0) {
                                    PrintEnterBlock(ctx,name,"SynForEachIterator(%.*s)",
                                                    (ulong)(uint)(*(int *)(*(long *)&pSVar6[1].
                                                                                     typeID + 0x48)
                                                                 - (int)*(undefined8 *)
                                                                         (*(long *)&pSVar6[1].typeID
                                                                         + 0x40)));
                                    PrintGraph(ctx,(SynBase *)pSVar6[1]._vptr_SynBase,"type");
                                    pSVar6 = (SynBase *)pSVar6[1].begin;
                                    goto LAB_001d34f3;
                                  }
                                  if ((syntax == (SynBase *)0x0) ||
                                     (pSVar6 = syntax, syntax->typeID != 0x2a)) {
                                    pSVar6 = (SynBase *)0x0;
                                  }
                                  if (pSVar6 == (SynBase *)0x0) {
                                    if ((syntax == (SynBase *)0x0) ||
                                       (pSVar6 = syntax, syntax->typeID != 0x2b)) {
                                      pSVar6 = (SynBase *)0x0;
                                    }
                                    if (pSVar6 == (SynBase *)0x0) {
                                      if ((syntax == (SynBase *)0x0) ||
                                         (pSVar6 = syntax, syntax->typeID != 0x2c)) {
                                        pSVar6 = (SynBase *)0x0;
                                      }
                                      if (pSVar6 != (SynBase *)0x0) {
                                        PrintEnterBlock(ctx,name,"SynDoWhile()");
                                        PrintEnterBlock(ctx,"expressions");
                                        for (pSVar12 = (SynBase *)pSVar6[1]._vptr_SynBase;
                                            pSVar12 != (SynBase *)0x0; pSVar12 = pSVar12->next) {
                                          PrintGraph(ctx,pSVar12,"");
                                        }
                                        PrintLeaveBlock(ctx);
                                        pSVar6 = (SynBase *)pSVar6[1].begin;
                                        pcVar9 = "condition";
                                        goto LAB_001d33b2;
                                      }
                                      if ((syntax == (SynBase *)0x0) ||
                                         (pSVar6 = syntax, syntax->typeID != 0x2d)) {
                                        pSVar6 = (SynBase *)0x0;
                                      }
                                      if (pSVar6 == (SynBase *)0x0) {
                                        if ((syntax == (SynBase *)0x0) ||
                                           (pSVar6 = syntax, syntax->typeID != 0x2e)) {
                                          pSVar6 = (SynBase *)0x0;
                                        }
                                        if (pSVar6 == (SynBase *)0x0) {
                                          if ((syntax == (SynBase *)0x0) ||
                                             (pSVar6 = syntax, syntax->typeID != 0x2f)) {
                                            pSVar6 = (SynBase *)0x0;
                                          }
                                          if (pSVar6 != (SynBase *)0x0) {
                                            pcVar9 = GetOpName(*(SynUnaryOpType *)
                                                                &pSVar6->field_0x3c);
                                            pcVar10 = "SynUnaryOp(%s)";
                                            goto LAB_001d3956;
                                          }
                                          if ((syntax == (SynBase *)0x0) ||
                                             (pSVar6 = syntax, syntax->typeID != 0x30)) {
                                            pSVar6 = (SynBase *)0x0;
                                          }
                                          if (pSVar6 == (SynBase *)0x0) {
                                            if ((syntax == (SynBase *)0x0) ||
                                               (pSVar6 = syntax, syntax->typeID != 0x31)) {
                                              pSVar6 = (SynBase *)0x0;
                                            }
                                            if (pSVar6 == (SynBase *)0x0) {
                                              if ((syntax == (SynBase *)0x0) ||
                                                 (pSVar6 = syntax, syntax->typeID != 0x32)) {
                                                pSVar6 = (SynBase *)0x0;
                                              }
                                              if (pSVar6 == (SynBase *)0x0) {
                                                if ((syntax == (SynBase *)0x0) ||
                                                   (pSVar6 = syntax, syntax->typeID != 0x33)) {
                                                  pSVar6 = (SynBase *)0x0;
                                                }
                                                if (pSVar6 != (SynBase *)0x0) {
                                                  uVar8 = (ulong)(uint)(*(int *)(pSVar6[1].
                                                                                 _vptr_SynBase + 9)
                                                                       - (int)pSVar6[1].
                                                                              _vptr_SynBase[8]);
                                                  if (*(long *)&pSVar6[1].typeID == 0) {
                                                    pcVar9 = "SynVariableDefinition(%.*s)";
                                                    goto LAB_001d3217;
                                                  }
                                                  PrintEnterBlock(ctx,name,
                                                  "SynVariableDefinition(%.*s)",uVar8);
                                                  pSVar6 = *(SynBase **)&pSVar6[1].typeID;
LAB_001d419e:
                                                  pcVar9 = "initializer";
                                                  goto LAB_001d33b2;
                                                }
                                                if ((syntax == (SynBase *)0x0) ||
                                                   (pSVar6 = syntax, syntax->typeID != 0x34)) {
                                                  pSVar6 = (SynBase *)0x0;
                                                }
                                                if (pSVar6 == (SynBase *)0x0) {
                                                  if ((syntax == (SynBase *)0x0) ||
                                                     (pSVar6 = syntax, syntax->typeID != 0x35)) {
                                                    pSVar6 = (SynBase *)0x0;
                                                  }
                                                  if (pSVar6 != (SynBase *)0x0) {
                                                    pcVar9 = pSVar6[1].pos.begin;
                                                    uVar3 = *(undefined8 *)
                                                             (*(long *)&pSVar6[1].typeID + 0x40);
                                                    uVar8 = (ulong)(uint)(*(int *)(*(long *)&pSVar6[
                                                  1].typeID + 0x48) - (int)uVar3);
                                                  if (pcVar9 == (char *)0x0) {
                                                    PrintEnterBlock(ctx,name,"SynAccessor(%.*s)",
                                                                    uVar8);
                                                  }
                                                  else {
                                                    PrintEnterBlock(ctx,name,
                                                  "SynAccessor(%.*s, %.*s)",uVar8,uVar3,
                                                  (ulong)(uint)(*(int *)(pcVar9 + 0x48) -
                                                               (int)*(undefined8 *)(pcVar9 + 0x40)),
                                                  *(undefined8 *)(pcVar9 + 0x40));
                                                  }
                                                  PrintGraph(ctx,(SynBase *)pSVar6[1].begin,
                                                             "getBlock");
                                                  pSVar6 = (SynBase *)pSVar6[1].end;
                                                  pcVar9 = "setBlock";
                                                  goto LAB_001d33b2;
                                                  }
                                                  if ((syntax == (SynBase *)0x0) ||
                                                     (pSVar6 = syntax, syntax->typeID != 0x36)) {
                                                    pSVar6 = (SynBase *)0x0;
                                                  }
                                                  if (pSVar6 != (SynBase *)0x0) {
                                                    pcVar9 = "";
                                                    if (pSVar6->field_0x3a != '\0') {
                                                      pcVar9 = "explicit, ";
                                                    }
                                                    PrintEnterBlock(ctx,name,
                                                  "SynFunctionArgument(%s%.*s)",pcVar9,
                                                  (ulong)(uint)(*(int *)(*(long *)&pSVar6[1].typeID
                                                                        + 0x48) -
                                                               (int)*(undefined8 *)
                                                                     (*(long *)&pSVar6[1].typeID +
                                                                     0x40)));
                                                  PrintGraph(ctx,(SynBase *)pSVar6[1]._vptr_SynBase,
                                                             "type");
                                                  pSVar6 = (SynBase *)pSVar6[1].begin;
                                                  goto LAB_001d419e;
                                                  }
                                                  if ((syntax == (SynBase *)0x0) ||
                                                     (pSVar6 = syntax, syntax->typeID != 0x37)) {
                                                    pSVar6 = (SynBase *)0x0;
                                                  }
                                                  if (pSVar6 == (SynBase *)0x0) {
                                                    if ((syntax == (SynBase *)0x0) ||
                                                       (pSVar6 = syntax, syntax->typeID != 0x38)) {
                                                      pSVar6 = (SynBase *)0x0;
                                                    }
                                                    if (pSVar6 != (SynBase *)0x0) {
                                                      uVar7 = *(int *)(*(long *)&pSVar6[1].typeID +
                                                                      0x48) -
                                                              (int)*(undefined8 *)
                                                                    (*(long *)&pSVar6[1].typeID +
                                                                    0x40);
                                                      pcVar9 = "SynShortFunctionArgument(%.*s)";
                                                      goto LAB_001d36e2;
                                                    }
                                                    if ((syntax == (SynBase *)0x0) ||
                                                       (pSVar6 = syntax, syntax->typeID != 0x39)) {
                                                      pSVar6 = (SynBase *)0x0;
                                                    }
                                                    if (pSVar6 == (SynBase *)0x0) {
                                                      if ((syntax == (SynBase *)0x0) ||
                                                         (pSVar6 = syntax, syntax->typeID != 0x3a))
                                                      {
                                                        pSVar6 = (SynBase *)0x0;
                                                      }
                                                      if (pSVar6 != (SynBase *)0x0) {
                                                        uVar7 = *(int *)(pSVar6[1]._vptr_SynBase + 9
                                                                        ) -
                                                                (int)pSVar6[1]._vptr_SynBase[8];
                                                        pcVar9 = "SynConstant(%.*s)";
                                                        goto LAB_001d376a;
                                                      }
                                                      if ((syntax == (SynBase *)0x0) ||
                                                         (pSVar6 = syntax, syntax->typeID != 0x3b))
                                                      {
                                                        pSVar6 = (SynBase *)0x0;
                                                      }
                                                      if (pSVar6 == (SynBase *)0x0) {
                                                        if ((syntax == (SynBase *)0x0) ||
                                                           (pSVar6 = syntax, syntax->typeID != 0x3c)
                                                           ) {
                                                          pSVar6 = (SynBase *)0x0;
                                                        }
                                                        if (pSVar6 != (SynBase *)0x0) {
                                                          uVar8 = (ulong)(uint)(*(int *)(pSVar6[1].
                                                                                                                                                                                  
                                                  _vptr_SynBase + 9) -
                                                  (int)pSVar6[1]._vptr_SynBase[8]);
                                                  pcVar9 = "SynClassPrototype(%.*s)";
                                                  goto LAB_001d3217;
                                                  }
                                                  if ((syntax == (SynBase *)0x0) ||
                                                     (pSVar6 = syntax, syntax->typeID != 0x3d)) {
                                                    pSVar6 = (SynBase *)0x0;
                                                  }
                                                  if (pSVar6 != (SynBase *)0x0) {
                                                    pcVar9 = "SynClassStaticIf()";
                                                    goto LAB_001d3aba;
                                                  }
                                                  if ((syntax == (SynBase *)0x0) ||
                                                     (pSVar6 = syntax, syntax->typeID != 0x3e)) {
                                                    pSVar6 = (SynBase *)0x0;
                                                  }
                                                  if (pSVar6 == (SynBase *)0x0) {
                                                    if ((syntax == (SynBase *)0x0) ||
                                                       (pSVar6 = syntax, syntax->typeID != 0x3f)) {
                                                      pSVar6 = (SynBase *)0x0;
                                                    }
                                                    if (pSVar6 != (SynBase *)0x0) {
                                                      uVar3 = *(undefined8 *)
                                                               (*(long *)&pSVar6[1].typeID + 0x40);
                                                      pcVar9 = "";
                                                      if (*(char *)&pSVar6[1].pos.begin != '\0') {
                                                        pcVar9 = ", extendable";
                                                      }
                                                      PrintEnterBlock(ctx,name,
                                                  "SynClassDefinition(%.*s%s)",
                                                  (ulong)(uint)(*(int *)(*(long *)&pSVar6[1].typeID
                                                                        + 0x48) - (int)uVar3),uVar3,
                                                  pcVar9);
                                                  PrintGraph(ctx,(SynBase *)pSVar6[1]._vptr_SynBase,
                                                             "align");
                                                  PrintEnterBlock(ctx,"aliases");
                                                  for (pSVar12 = (SynBase *)pSVar6[1].begin;
                                                      pSVar12 != (SynBase *)0x0;
                                                      pSVar12 = pSVar12->next) {
                                                    PrintGraph(ctx,pSVar12,"");
                                                  }
                                                  PrintLeaveBlock(ctx);
                                                  PrintGraph(ctx,(SynBase *)pSVar6[1].pos.end,
                                                             "baseClass");
                                                  pSVar6 = pSVar6[1].next;
                                                  pcVar9 = "elements";
                                                  goto LAB_001d33b2;
                                                  }
                                                  if ((syntax == (SynBase *)0x0) ||
                                                     (pSVar6 = syntax, syntax->typeID != 0x40)) {
                                                    pSVar6 = (SynBase *)0x0;
                                                  }
                                                  if (pSVar6 != (SynBase *)0x0) {
                                                    PrintEnterBlock(ctx,name,
                                                  "SynEnumDefinition(%.*s)",
                                                  (ulong)(uint)(*(int *)(pSVar6[1]._vptr_SynBase + 9
                                                                        ) -
                                                               (int)pSVar6[1]._vptr_SynBase[8]));
                                                  for (pSVar6 = *(SynBase **)&pSVar6[1].typeID;
                                                      pSVar6 != (SynBase *)0x0;
                                                      pSVar6 = pSVar6->next) {
                                                    PrintGraph(ctx,pSVar6,"");
                                                  }
                                                  goto LAB_001d33ba;
                                                  }
                                                  if ((syntax == (SynBase *)0x0) ||
                                                     (pSVar6 = syntax, syntax->typeID != 0x41)) {
                                                    pSVar6 = (SynBase *)0x0;
                                                  }
                                                  if (pSVar6 == (SynBase *)0x0) {
                                                    if ((syntax == (SynBase *)0x0) ||
                                                       (pSVar6 = syntax, syntax->typeID != 0x42)) {
                                                      pSVar6 = (SynBase *)0x0;
                                                    }
                                                    if (pSVar6 == (SynBase *)0x0) {
                                                      if ((syntax == (SynBase *)0x0) ||
                                                         (pSVar6 = syntax, syntax->typeID != 0x43))
                                                      {
                                                        pSVar6 = (SynBase *)0x0;
                                                      }
                                                      if (pSVar6 != (SynBase *)0x0) {
                                                        PrintEnterBlock(ctx,name,"SynModule()");
                                                        PrintEnterBlock(ctx,"imports");
                                                        pSVar12 = (SynBase *)pSVar6[1]._vptr_SynBase
                                                        ;
                                                        while (pSVar12 != (SynBase *)0x0) {
                                                          PrintGraph(ctx,pSVar12,"");
                                                          pSVar12 = pSVar12->next;
                                                          if ((pSVar12 == (SynBase *)0x0) ||
                                                             (pSVar12->typeID != 0x42)) {
                                                            pSVar12 = (SynBase *)0x0;
                                                          }
                                                        }
                                                        PrintLeaveBlock(ctx);
                                                        PrintEnterBlock(ctx,"expressions");
                                                        for (pSVar6 = (SynBase *)pSVar6[1].begin;
                                                            pSVar6 != (SynBase *)0x0;
                                                            pSVar6 = pSVar6->next) {
                                                          PrintGraph(ctx,pSVar6,"");
                                                        }
                                                        PrintLeaveBlock(ctx);
                                                        PrintLeaveBlock(ctx);
                                                        pOVar5 = ctx->output;
                                                        if (pOVar5->outputBufPos != 0) {
                                                          (*pOVar5->writeStream)
                                                                    (pOVar5->stream,
                                                                     pOVar5->outputBuf,
                                                                     pOVar5->outputBufPos);
                                                        }
                                                        pOVar5->outputBufPos = 0;
                                                        return;
                                                      }
                                                      if (syntax != (SynBase *)0x0) {
                                                        __assert_fail("!\"unknown type\"",
                                                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseGraph.cpp"
                                                  ,0x34a,
                                                  "void PrintGraph(ParseGraphContext &, SynBase *, const char *)"
                                                  );
                                                  }
                                                  pcVar9 = "null";
LAB_001d31b1:
                                                  PrintIndented(ctx,name,pcVar9);
                                                  return;
                                                  }
                                                  PrintEnterBlock(ctx,name,"SynModuleImport()");
                                                  pSVar6 = (SynBase *)pSVar6[1]._vptr_SynBase;
                                                  while (pSVar6 != (SynBase *)0x0) {
                                                    PrintGraph(ctx,pSVar6,"");
                                                    pSVar6 = pSVar6->next;
                                                    if ((pSVar6 == (SynBase *)0x0) ||
                                                       (pSVar6->typeID != 4)) {
                                                      pSVar6 = (SynBase *)0x0;
                                                    }
                                                  }
                                                  goto LAB_001d33ba;
                                                  }
                                                  PrintEnterBlock(ctx,name,
                                                  "SynNamespaceDefinition()");
                                                  PrintEnterBlock(ctx,"path");
                                                  pSVar12 = (SynBase *)pSVar6[1]._vptr_SynBase;
                                                  while (pSVar12 != (SynBase *)0x0) {
                                                    PrintGraph(ctx,pSVar12,"");
                                                    pSVar12 = pSVar12->next;
                                                    if ((pSVar12 == (SynBase *)0x0) ||
                                                       (pSVar12->typeID != 4)) {
                                                      pSVar12 = (SynBase *)0x0;
                                                    }
                                                  }
                                                  PrintLeaveBlock(ctx);
                                                  PrintEnterBlock(ctx,"expressions");
                                                  for (pSVar6 = (SynBase *)pSVar6[1].begin;
                                                      pSVar6 != (SynBase *)0x0;
                                                      pSVar6 = pSVar6->next) {
                                                    PrintGraph(ctx,pSVar6,"");
                                                  }
                                                  }
                                                  else {
                                                    PrintEnterBlock(ctx,name,"SynClassElements()");
                                                    if (pSVar6[1]._vptr_SynBase != (_func_int **)0x0
                                                       ) {
                                                      PrintEnterBlock(ctx,"typedefs");
                                                      for (pSVar12 = (SynBase *)
                                                                     pSVar6[1]._vptr_SynBase;
                                                          pSVar12 != (SynBase *)0x0;
                                                          pSVar12 = pSVar12->next) {
                                                        PrintGraph(ctx,pSVar12,"");
                                                      }
                                                      PrintLeaveBlock(ctx);
                                                    }
                                                    if (pSVar6[1].begin != (Lexeme *)0x0) {
                                                      PrintEnterBlock(ctx,"functions");
                                                      for (pSVar12 = (SynBase *)pSVar6[1].begin;
                                                          pSVar12 != (SynBase *)0x0;
                                                          pSVar12 = pSVar12->next) {
                                                        PrintGraph(ctx,pSVar12,"");
                                                      }
                                                      PrintLeaveBlock(ctx);
                                                    }
                                                    if (pSVar6[1].pos.begin != (char *)0x0) {
                                                      PrintEnterBlock(ctx,"accessors");
                                                      for (pSVar12 = (SynBase *)pSVar6[1].pos.begin;
                                                          pSVar12 != (SynBase *)0x0;
                                                          pSVar12 = pSVar12->next) {
                                                        PrintGraph(ctx,pSVar12,"");
                                                      }
                                                      PrintLeaveBlock(ctx);
                                                    }
                                                    if (pSVar6[1].next != (SynBase *)0x0) {
                                                      PrintEnterBlock(ctx,"members");
                                                      for (pSVar12 = pSVar6[1].next;
                                                          pSVar12 != (SynBase *)0x0;
                                                          pSVar12 = pSVar12->next) {
                                                        PrintGraph(ctx,pSVar12,"");
                                                      }
                                                      PrintLeaveBlock(ctx);
                                                    }
                                                    if (pSVar6[2]._vptr_SynBase != (_func_int **)0x0
                                                       ) {
                                                      PrintEnterBlock(ctx,"constantSets");
                                                      for (pSVar12 = (SynBase *)
                                                                     pSVar6[2]._vptr_SynBase;
                                                          pSVar12 != (SynBase *)0x0;
                                                          pSVar12 = pSVar12->next) {
                                                        PrintGraph(ctx,pSVar12,"");
                                                      }
                                                      PrintLeaveBlock(ctx);
                                                    }
                                                    if (pSVar6[2].begin == (Lexeme *)0x0)
                                                    goto LAB_001d33ba;
                                                    PrintEnterBlock(ctx,"staticIfs");
                                                    for (pSVar6 = (SynBase *)pSVar6[2].begin;
                                                        pSVar6 != (SynBase *)0x0;
                                                        pSVar6 = pSVar6->next) {
                                                      PrintGraph(ctx,pSVar6,"");
                                                    }
                                                  }
                                                  }
                                                  else {
                                                    PrintEnterBlock(ctx,name,"SynConstantSet()");
                                                    PrintGraph(ctx,(SynBase *)
                                                                   pSVar6[1]._vptr_SynBase,"type");
                                                    PrintEnterBlock(ctx,"constants");
                                                    for (pSVar6 = *(SynBase **)&pSVar6[1].typeID;
                                                        pSVar6 != (SynBase *)0x0;
                                                        pSVar6 = pSVar6->next) {
                                                      PrintGraph(ctx,pSVar6,"");
                                                    }
                                                  }
                                                  }
                                                  else {
                                                    PrintEnterBlock(ctx,name,
                                                  "SynShortFunctionDefinition()");
                                                  PrintEnterBlock(ctx,"arguments");
                                                  for (pSVar12 = (SynBase *)pSVar6[1]._vptr_SynBase;
                                                      pSVar12 != (SynBase *)0x0;
                                                      pSVar12 = pSVar12->next) {
                                                    PrintGraph(ctx,pSVar12,"");
                                                  }
                                                  PrintLeaveBlock(ctx);
                                                  PrintEnterBlock(ctx,"expressions");
                                                  for (pSVar6 = (SynBase *)pSVar6[1].begin;
                                                      pSVar6 != (SynBase *)0x0;
                                                      pSVar6 = pSVar6->next) {
                                                    PrintGraph(ctx,pSVar6,"");
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar9 = "prototype, ";
                                                    if (pSVar6->field_0x3a == '\0') {
                                                      pcVar9 = "";
                                                    }
                                                    pcVar10 = "coroutine, ";
                                                    if (pSVar6->field_0x3b == '\0') {
                                                      pcVar10 = "";
                                                    }
                                                    pcVar11 = "accessor, ";
                                                    if ((char)pSVar6[1].typeID == '\0') {
                                                      pcVar11 = "";
                                                    }
                                                    pcVar4 = pSVar6[1].pos.begin;
                                                    uVar3 = *(undefined8 *)(pcVar4 + 0x40);
                                                    PrintEnterBlock(ctx,name,
                                                  "SynFunctionDefinition(%s%s%s%.*s)",pcVar9,pcVar10
                                                  ,pcVar11,(ulong)(uint)(*(int *)(pcVar4 + 0x48) -
                                                                        (int)uVar3),uVar3);
                                                  PrintGraph(ctx,(SynBase *)pSVar6[1]._vptr_SynBase,
                                                             "parentType");
                                                  PrintGraph(ctx,(SynBase *)pSVar6[1].begin,
                                                             "returnType");
                                                  PrintEnterBlock(ctx,"aliases");
                                                  for (pSVar12 = (SynBase *)pSVar6[1].pos.end;
                                                      pSVar12 != (SynBase *)0x0;
                                                      pSVar12 = pSVar12->next) {
                                                    PrintGraph(ctx,pSVar12,"");
                                                  }
                                                  PrintLeaveBlock(ctx);
                                                  PrintEnterBlock(ctx,"arguments");
                                                  for (pSVar12 = *(SynBase **)&pSVar6[1].listed;
                                                      pSVar12 != (SynBase *)0x0;
                                                      pSVar12 = pSVar12->next) {
                                                    PrintGraph(ctx,pSVar12,"");
                                                  }
                                                  PrintLeaveBlock(ctx);
                                                  PrintEnterBlock(ctx,"expressions");
                                                  for (pSVar6 = *(SynBase **)&pSVar6[2].typeID;
                                                      pSVar6 != (SynBase *)0x0;
                                                      pSVar6 = pSVar6->next) {
                                                    PrintGraph(ctx,pSVar6,"");
                                                  }
                                                  }
                                                }
                                                else {
                                                  PrintEnterBlock(ctx,name,
                                                  "SynVariableDefinitions()");
                                                  PrintGraph(ctx,(SynBase *)pSVar6[1]._vptr_SynBase,
                                                             "align");
                                                  PrintGraph(ctx,*(SynBase **)&pSVar6[1].typeID,
                                                             "type");
                                                  PrintEnterBlock(ctx,"definitions");
                                                  for (pSVar6 = (SynBase *)pSVar6[1].begin;
                                                      pSVar6 != (SynBase *)0x0;
                                                      pSVar6 = pSVar6->next) {
                                                    PrintGraph(ctx,pSVar6,"");
                                                  }
                                                }
                                                goto LAB_001d3373;
                                              }
                                              pcVar9 = GetOpName(*(SynModifyAssignType *)
                                                                  &pSVar6->field_0x3c);
                                              pcVar10 = "SynModifyAssignment(%s)";
                                              goto LAB_001d3fb6;
                                            }
                                            PrintEnterBlock(ctx,name,"SynAssignment()");
                                          }
                                          else {
                                            pcVar9 = GetOpName(*(SynBinaryOpType *)
                                                                &pSVar6->field_0x3c);
                                            pcVar10 = "SynBinaryOp(%s)";
LAB_001d3fb6:
                                            PrintEnterBlock(ctx,name,pcVar10,pcVar9);
                                          }
                                          PrintGraph(ctx,(SynBase *)pSVar6[1]._vptr_SynBase,"lhs");
                                          pSVar6 = *(SynBase **)&pSVar6[1].typeID;
                                          pcVar9 = "rhs";
                                          goto LAB_001d33b2;
                                        }
                                        PrintEnterBlock(ctx,name,"SynSwitch()");
                                        PrintGraph(ctx,(SynBase *)pSVar6[1]._vptr_SynBase,
                                                   "condition");
                                        PrintEnterBlock(ctx,"cases");
                                        for (pSVar6 = *(SynBase **)&pSVar6[1].typeID;
                                            pSVar6 != (SynBase *)0x0; pSVar6 = pSVar6->next) {
                                          PrintGraph(ctx,pSVar6,"");
                                        }
                                      }
                                      else {
                                        PrintEnterBlock(ctx,name,"SynSwitchCase()");
                                        PrintGraph(ctx,(SynBase *)pSVar6[1]._vptr_SynBase,"value");
                                        PrintEnterBlock(ctx,"expressions");
                                        for (pSVar6 = *(SynBase **)&pSVar6[1].typeID;
                                            pSVar6 != (SynBase *)0x0; pSVar6 = pSVar6->next) {
                                          PrintGraph(ctx,pSVar6,"");
                                        }
                                      }
                                      goto LAB_001d3373;
                                    }
                                    PrintEnterBlock(ctx,name,"SynWhile()");
                                    PrintGraph(ctx,(SynBase *)pSVar6[1]._vptr_SynBase,"condition");
                                    pSVar6 = *(SynBase **)&pSVar6[1].typeID;
                                  }
                                  else {
                                    PrintEnterBlock(ctx,name,"SynForEach()");
                                    PrintEnterBlock(ctx,"iterators");
                                    for (pSVar12 = (SynBase *)pSVar6[1]._vptr_SynBase;
                                        pSVar12 != (SynBase *)0x0; pSVar12 = pSVar12->next) {
                                      PrintGraph(ctx,pSVar12,"");
                                    }
                                    PrintLeaveBlock(ctx);
                                    pSVar6 = (SynBase *)pSVar6[1].begin;
                                  }
LAB_001d3c7d:
                                  pcVar9 = "body";
                                  goto LAB_001d33b2;
                                }
                                pcVar9 = "SynContinue()";
                              }
                              else {
                                pcVar9 = "SynBreak()";
                              }
                              PrintEnterBlock(ctx,name,pcVar9);
                              pSVar6 = (SynBase *)pSVar6[1]._vptr_SynBase;
                              pcVar9 = "number";
                              goto LAB_001d33b2;
                            }
                            pcVar9 = "SynYield()";
                          }
                          else {
                            pcVar9 = "SynReturn()";
                          }
                        }
                        else {
                          pcVar9 = "SynSizeof()";
                        }
                      }
                      else {
                        pcVar9 = "SynDereference()";
                      }
                    }
                    else {
                      pcVar9 = "SynGetAddress()";
                    }
LAB_001d34e2:
                    PrintEnterBlock(ctx,name,pcVar9);
                    goto LAB_001d34ef;
                  }
                  pcVar9 = "))--";
                  if ((char)pSVar6[1].typeID != '\0') {
                    pcVar9 = "))++";
                  }
                  pcVar9 = pcVar9 + 2;
                  pcVar10 = "SynPostModify(%s)";
                }
                else {
                  pcVar9 = "))--";
                  if ((char)pSVar6[1].typeID != '\0') {
                    pcVar9 = "))++";
                  }
                  pcVar9 = pcVar9 + 2;
                  pcVar10 = "SynPreModify(%s)";
                }
LAB_001d3956:
                PrintEnterBlock(ctx,name,pcVar10,pcVar9);
                goto LAB_001d34ef;
              }
              PrintEnterBlock(ctx,name,"SynFunctionCall()");
              PrintGraph(ctx,(SynBase *)pSVar6[1]._vptr_SynBase,"value");
              PrintEnterBlock(ctx,"aliases");
              for (pSVar12 = *(SynBase **)&pSVar6[1].typeID; pSVar12 != (SynBase *)0x0;
                  pSVar12 = pSVar12->next) {
                PrintGraph(ctx,pSVar12,"");
              }
              PrintLeaveBlock(ctx);
              PrintEnterBlock(ctx,"arguments");
              for (pSVar6 = (SynBase *)pSVar6[1].end; pSVar6 != (SynBase *)0x0;
                  pSVar6 = pSVar6->next) {
                PrintGraph(ctx,pSVar6,"");
              }
            }
            else {
              PrintEnterBlock(ctx,name,"SynArrayIndex()");
              PrintGraph(ctx,(SynBase *)pSVar6[1]._vptr_SynBase,"value");
              PrintEnterBlock(ctx,"arguments");
              for (pSVar6 = *(SynBase **)&pSVar6[1].typeID; pSVar6 != (SynBase *)0x0;
                  pSVar6 = pSVar6->next) {
                PrintGraph(ctx,pSVar6,"");
              }
            }
            goto LAB_001d3373;
          }
          pp_Var2 = pSVar6[1]._vptr_SynBase;
          if (pp_Var2 == (_func_int **)0x0) {
            PrintEnterBlock(ctx,name,"SynCallArgument()");
          }
          else {
            uVar7 = *(int *)(pp_Var2 + 9) - (int)pp_Var2[8];
            pcVar9 = "SynCallArgument(%.*s)";
LAB_001d376a:
            PrintEnterBlock(ctx,name,pcVar9,(ulong)uVar7);
          }
          pSVar6 = *(SynBase **)&pSVar6[1].typeID;
        }
        else {
          lVar1 = *(long *)&pSVar6[1].typeID;
          if (lVar1 == 0) {
            pcVar9 = "SynMemberAccess(%%missing%%)";
            goto LAB_001d34e2;
          }
          PrintEnterBlock(ctx,name,"SynMemberAccess(%.*s)",
                          (ulong)(uint)(*(int *)(lVar1 + 0x48) - (int)*(undefined8 *)(lVar1 + 0x40))
                         );
LAB_001d34ef:
          pSVar6 = (SynBase *)pSVar6[1]._vptr_SynBase;
        }
LAB_001d34f3:
        pcVar9 = "value";
        goto LAB_001d33b2;
      }
      PrintEnterBlock(ctx,name,"SynTypeGenericInstance()");
      PrintGraph(ctx,(SynBase *)pSVar6[1]._vptr_SynBase,"baseType");
      PrintEnterBlock(ctx,"types");
      for (pSVar6 = *(SynBase **)&pSVar6[1].typeID; pSVar6 != (SynBase *)0x0; pSVar6 = pSVar6->next)
      {
        PrintGraph(ctx,pSVar6,"");
      }
    }
    else {
      PrintEnterBlock(ctx,name,"SynTypeFunction()");
      PrintGraph(ctx,(SynBase *)pSVar6[1]._vptr_SynBase,"returnType");
      PrintEnterBlock(ctx,"arguments");
      for (pSVar6 = *(SynBase **)&pSVar6[1].typeID; pSVar6 != (SynBase *)0x0; pSVar6 = pSVar6->next)
      {
        PrintGraph(ctx,pSVar6,"");
      }
    }
LAB_001d3373:
    PrintLeaveBlock(ctx);
  }
  else {
    PrintEnterBlock(ctx,name,"SynTypeReference()");
LAB_001d33a7:
    pSVar6 = (SynBase *)pSVar6[1]._vptr_SynBase;
    pcVar9 = "type";
LAB_001d33b2:
    PrintGraph(ctx,pSVar6,pcVar9);
  }
LAB_001d33ba:
  PrintLeaveBlock(ctx);
  return;
}

Assistant:

void PrintGraph(ParseGraphContext &ctx, SynBase *syntax, const char *name)
{
	if(ctx.depth > 1024)
	{
		PrintIndented(ctx, name, "{...}");
		return;
	}

	if(isType<SynError>(syntax))
	{
		PrintIndented(ctx, name, "SynError()");
	}
	else if(isType<SynNothing>(syntax))
	{
		PrintIndented(ctx, name, "SynNothing()");
	}
	else if(SynIdentifier *node = getType<SynIdentifier>(syntax))
	{
		PrintIndented(ctx, name, "SynIdentifier(%.*s)", FMT_ISTR(node->name));
	}
	else if(isType<SynTypeAuto>(syntax))
	{
		PrintIndented(ctx, name, "SynTypeAuto()");
	}
	else if(isType<SynTypeGeneric>(syntax))
	{
		PrintIndented(ctx, name, "SynTypeGeneric()");
	}
	else if(SynTypeSimple *node = getType<SynTypeSimple>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynTypeSimple(%.*s)", FMT_ISTR(node->name));

		for(SynIdentifier *part = node->path.head; part; part = getType<SynIdentifier>(part->next))
			PrintGraph(ctx, part, "");

		PrintLeaveBlock(ctx);
	}
	else if(SynTypeAlias *node = getType<SynTypeAlias>(syntax))
	{
		PrintIndented(ctx, name, "SynTypeAlias(%.*s)", FMT_ISTR(node->name->name));
	}
	else if(SynTypeArray *node = getType<SynTypeArray>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynTypeArray()");

		PrintGraph(ctx, node->type, "type");

		PrintEnterBlock(ctx, "sizes");

		for(SynBase *size = node->sizes.head; size; size = size->next)
			PrintGraph(ctx, size, "");

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);
	}
	else if(SynTypeReference *node = getType<SynTypeReference>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynTypeReference()");

		PrintGraph(ctx, node->type, "type");

		PrintLeaveBlock(ctx);
	}
	else if(SynTypeFunction *node = getType<SynTypeFunction>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynTypeFunction()");

		PrintGraph(ctx, node->returnType, "returnType");

		PrintEnterBlock(ctx, "arguments");

		for(SynBase *arg = node->arguments.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);
	}
	else if(SynTypeGenericInstance *node = getType<SynTypeGenericInstance>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynTypeGenericInstance()");

		PrintGraph(ctx, node->baseType, "baseType");

		PrintEnterBlock(ctx, "types");

		for(SynBase *type = node->types.head; type; type = type->next)
			PrintGraph(ctx, type, "");

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);
	}
	else if(SynTypeof *node = getType<SynTypeof>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynTypeof()");

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(SynBool *node = getType<SynBool>(syntax))
	{
		PrintIndented(ctx, name, "SynBool(%s)", node->value ? "true" : "false");
	}
	else if(SynNumber *node = getType<SynNumber>(syntax))
	{
		PrintIndented(ctx, name, "SynNumber(%.*s)", FMT_ISTR(node->value));
	}
	else if(isType<SynNullptr>(syntax))
	{
		PrintIndented(ctx, name, "SynNullptr()");
	}
	else if(SynCharacter *node = getType<SynCharacter>(syntax))
	{
		PrintIndented(ctx, name, "SynCharacter(%.*s)", FMT_ISTR(node->value));
	}
	else if(SynString *node = getType<SynString>(syntax))
	{
		PrintIndented(ctx, name, "SynString(%.*s)", FMT_ISTR(node->value));
	}
	else if(SynArray *node = getType<SynArray>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynArray()");

		for(SynBase *value = node->values.head; value; value = value->next)
			PrintGraph(ctx, value, "");

		PrintLeaveBlock(ctx);
	}
	else if(SynGenerator *node = getType<SynGenerator>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynGenerator()");

		for(SynBase *value = node->expressions.head; value; value = value->next)
			PrintGraph(ctx, value, "");

		PrintLeaveBlock(ctx);
	}
	else if(SynAlign *node = getType<SynAlign>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynAlign()");

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(SynTypedef *node = getType<SynTypedef>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynTypedef(%.*s)", FMT_ISTR(node->alias->name));

		PrintGraph(ctx, node->type, "type");

		PrintLeaveBlock(ctx);
	}
	else if(SynMemberAccess *node = getType<SynMemberAccess>(syntax))
	{
		if(node->member)
			PrintEnterBlock(ctx, name, "SynMemberAccess(%.*s)", FMT_ISTR(node->member->name));
		else
			PrintEnterBlock(ctx, name, "SynMemberAccess(%%missing%%)");

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(SynCallArgument *node = getType<SynCallArgument>(syntax))
	{
		if(node->name)
			PrintEnterBlock(ctx, name, "SynCallArgument(%.*s)", FMT_ISTR(node->name->name));
		else
			PrintEnterBlock(ctx, name, "SynCallArgument()");

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(SynArrayIndex *node = getType<SynArrayIndex>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynArrayIndex()");

		PrintGraph(ctx, node->value, "value");

		PrintEnterBlock(ctx, "arguments");

		for(SynBase *arg = node->arguments.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);
	}
	else if(SynFunctionCall *node = getType<SynFunctionCall>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynFunctionCall()");

		PrintGraph(ctx, node->value, "value");

		PrintEnterBlock(ctx, "aliases");

		for(SynBase *arg = node->aliases.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintEnterBlock(ctx, "arguments");

		for(SynBase *arg = node->arguments.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);
	}
	else if(SynPreModify *node = getType<SynPreModify>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynPreModify(%s)", node->isIncrement ? "++" : "--");

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(SynPostModify *node = getType<SynPostModify>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynPostModify(%s)", node->isIncrement ? "++" : "--");

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(SynGetAddress *node = getType<SynGetAddress>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynGetAddress()");

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(SynDereference *node = getType<SynDereference>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynDereference()");

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(SynSizeof *node = getType<SynSizeof>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynSizeof()");

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(SynNew *node = getType<SynNew>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynNew()");

		PrintGraph(ctx, node->type, "type");

		PrintEnterBlock(ctx, "arguments");

		for(SynBase *arg = node->arguments.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintGraph(ctx, node->count, "count");

		PrintEnterBlock(ctx, "constructor");

		for(SynBase *arg = node->constructor.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);
	}
	else if(SynConditional *node = getType<SynConditional>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynConditional()");

		PrintGraph(ctx, node->condition, "condition");
		PrintGraph(ctx, node->trueBlock, "trueBlock");
		PrintGraph(ctx, node->falseBlock, "falseBlock");

		PrintLeaveBlock(ctx);
	}
	else if(SynReturn *node = getType<SynReturn>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynReturn()");

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(SynYield *node = getType<SynYield>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynYield()");

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(SynBreak *node = getType<SynBreak>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynBreak()");

		PrintGraph(ctx, node->number, "number");

		PrintLeaveBlock(ctx);
	}
	else if(SynContinue *node = getType<SynContinue>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynContinue()");

		PrintGraph(ctx, node->number, "number");

		PrintLeaveBlock(ctx);
	}
	else if(SynBlock *node = getType<SynBlock>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynBlock()");

		for(SynBase *expr = node->expressions.head; expr; expr = expr->next)
			PrintGraph(ctx, expr, "");

		PrintLeaveBlock(ctx);
	}
	else if(SynIfElse *node = getType<SynIfElse>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynIfElse()");

		PrintGraph(ctx, node->condition, "condition");
		PrintGraph(ctx, node->trueBlock, "trueBlock");
		PrintGraph(ctx, node->falseBlock, "falseBlock");

		PrintLeaveBlock(ctx);
	}
	else if(SynFor *node = getType<SynFor>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynFor()");

		PrintGraph(ctx, node->initializer, "initializer");
		PrintGraph(ctx, node->condition, "condition");
		PrintGraph(ctx, node->increment, "increment");
		PrintGraph(ctx, node->body, "body");

		PrintLeaveBlock(ctx);
	}
	else if(SynForEachIterator *node = getType<SynForEachIterator>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynForEachIterator(%.*s)", FMT_ISTR(node->name->name));

		PrintGraph(ctx, node->type, "type");
		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(SynForEach *node = getType<SynForEach>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynForEach()");

		PrintEnterBlock(ctx, "iterators");

		for(SynBase *arg = node->iterators.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintGraph(ctx, node->body, "body");

		PrintLeaveBlock(ctx);
	}
	else if(SynWhile *node = getType<SynWhile>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynWhile()");

		PrintGraph(ctx, node->condition, "condition");
		PrintGraph(ctx, node->body, "body");

		PrintLeaveBlock(ctx);
	}
	else if(SynDoWhile *node = getType<SynDoWhile>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynDoWhile()");

		PrintEnterBlock(ctx, "expressions");

		for(SynBase *arg = node->expressions.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintGraph(ctx, node->condition, "condition");

		PrintLeaveBlock(ctx);
	}
	else if(SynSwitchCase *node = getType<SynSwitchCase>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynSwitchCase()");

		PrintGraph(ctx, node->value, "value");

		PrintEnterBlock(ctx, "expressions");

		for(SynBase *arg = node->expressions.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);
	}
	else if(SynSwitch *node = getType<SynSwitch>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynSwitch()");

		PrintGraph(ctx, node->condition, "condition");

		PrintEnterBlock(ctx, "cases");

		for(SynBase *arg = node->cases.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);
	}
	else if(SynUnaryOp *node = getType<SynUnaryOp>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynUnaryOp(%s)", GetOpName(node->type));

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(SynBinaryOp *node = getType<SynBinaryOp>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynBinaryOp(%s)", GetOpName(node->type));

		PrintGraph(ctx, node->lhs, "lhs");
		PrintGraph(ctx, node->rhs, "rhs");

		PrintLeaveBlock(ctx);
	}
	else if(SynAssignment *node = getType<SynAssignment>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynAssignment()");

		PrintGraph(ctx, node->lhs, "lhs");
		PrintGraph(ctx, node->rhs, "rhs");

		PrintLeaveBlock(ctx);
	}
	else if(SynModifyAssignment *node = getType<SynModifyAssignment>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynModifyAssignment(%s)", GetOpName(node->type));

		PrintGraph(ctx, node->lhs, "lhs");
		PrintGraph(ctx, node->rhs, "rhs");

		PrintLeaveBlock(ctx);
	}
	else if(SynVariableDefinition *node = getType<SynVariableDefinition>(syntax))
	{
		if(node->initializer)
		{
			PrintEnterBlock(ctx, name, "SynVariableDefinition(%.*s)", FMT_ISTR(node->name->name));

			PrintGraph(ctx, node->initializer, "initializer");

			PrintLeaveBlock(ctx);
		}
		else
		{
			PrintIndented(ctx, name, "SynVariableDefinition(%.*s)", FMT_ISTR(node->name->name));
		}
	}
	else if(SynVariableDefinitions *node = getType<SynVariableDefinitions>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynVariableDefinitions()");

		PrintGraph(ctx, node->align, "align");
		PrintGraph(ctx, node->type, "type");

		PrintEnterBlock(ctx, "definitions");

		for(SynBase *arg = node->definitions.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);
	}
	else if(SynAccessor *node = getType<SynAccessor>(syntax))
	{
		if(node->setName)
			PrintEnterBlock(ctx, name, "SynAccessor(%.*s, %.*s)", FMT_ISTR(node->name->name), FMT_ISTR(node->setName->name));
		else
			PrintEnterBlock(ctx, name, "SynAccessor(%.*s)", FMT_ISTR(node->name->name));

		PrintGraph(ctx, node->getBlock, "getBlock");
		PrintGraph(ctx, node->setBlock, "setBlock");

		PrintLeaveBlock(ctx);
	}
	else if(SynFunctionArgument *node = getType<SynFunctionArgument>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynFunctionArgument(%s%.*s)", node->isExplicit ? "explicit, " : "", FMT_ISTR(node->name->name));

		PrintGraph(ctx, node->type, "type");
		PrintGraph(ctx, node->initializer, "initializer");

		PrintLeaveBlock(ctx);
	}
	else if(SynFunctionDefinition *node = getType<SynFunctionDefinition>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynFunctionDefinition(%s%s%s%.*s)", node->prototype ? "prototype, " : "", node->coroutine ? "coroutine, " : "", node->accessor ? "accessor, " : "", FMT_ISTR(node->name->name));

		PrintGraph(ctx, node->parentType, "parentType");
		PrintGraph(ctx, node->returnType, "returnType");

		PrintEnterBlock(ctx, "aliases");

		for(SynBase *arg = node->aliases.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintEnterBlock(ctx, "arguments");

		for(SynBase *arg = node->arguments.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintEnterBlock(ctx, "expressions");

		for(SynBase *arg = node->expressions.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);
	}
	else if(SynShortFunctionArgument *node = getType<SynShortFunctionArgument>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynShortFunctionArgument(%.*s)", FMT_ISTR(node->name->name));

		PrintGraph(ctx, node->type, "type");

		PrintLeaveBlock(ctx);
	}
	else if(SynShortFunctionDefinition *node = getType<SynShortFunctionDefinition>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynShortFunctionDefinition()");

		PrintEnterBlock(ctx, "arguments");

		for(SynBase *arg = node->arguments.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintEnterBlock(ctx, "expressions");

		for(SynBase *arg = node->expressions.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);
	}
	else if(SynConstant *node = getType<SynConstant>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynConstant(%.*s)", FMT_ISTR(node->name->name));

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(SynConstantSet *node = getType<SynConstantSet>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynConstantSet()");

		PrintGraph(ctx, node->type, "type");

		PrintEnterBlock(ctx, "constants");

		for(SynBase *arg = node->constants.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);
	}
	else if(SynClassPrototype *node = getType<SynClassPrototype>(syntax))
	{
		PrintIndented(ctx, name, "SynClassPrototype(%.*s)", FMT_ISTR(node->name->name));
	}
	else if(SynClassStaticIf *node = getType<SynClassStaticIf>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynClassStaticIf()");

		PrintGraph(ctx, node->condition, "condition");
		PrintGraph(ctx, node->trueBlock, "trueBlock");
		PrintGraph(ctx, node->falseBlock, "falseBlock");

		PrintLeaveBlock(ctx);
	}
	else if(SynClassElements *node = getType<SynClassElements>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynClassElements()");

		if(node->typedefs.head)
		{
			PrintEnterBlock(ctx, "typedefs");

			for(SynBase *arg = node->typedefs.head; arg; arg = arg->next)
				PrintGraph(ctx, arg, "");

			PrintLeaveBlock(ctx);
		}

		if(node->functions.head)
		{
			PrintEnterBlock(ctx, "functions");

			for(SynBase *arg = node->functions.head; arg; arg = arg->next)
				PrintGraph(ctx, arg, "");

			PrintLeaveBlock(ctx);
		}

		if(node->accessors.head)
		{
			PrintEnterBlock(ctx, "accessors");

			for(SynBase *arg = node->accessors.head; arg; arg = arg->next)
				PrintGraph(ctx, arg, "");

			PrintLeaveBlock(ctx);
		}

		if(node->members.head)
		{
			PrintEnterBlock(ctx, "members");

			for(SynBase *arg = node->members.head; arg; arg = arg->next)
				PrintGraph(ctx, arg, "");

			PrintLeaveBlock(ctx);
		}

		if(node->constantSets.head)
		{
			PrintEnterBlock(ctx, "constantSets");

			for(SynBase *arg = node->constantSets.head; arg; arg = arg->next)
				PrintGraph(ctx, arg, "");

			PrintLeaveBlock(ctx);
		}

		if(node->staticIfs.head)
		{
			PrintEnterBlock(ctx, "staticIfs");

			for(SynBase *arg = node->staticIfs.head; arg; arg = arg->next)
				PrintGraph(ctx, arg, "");

			PrintLeaveBlock(ctx);
		}

		PrintLeaveBlock(ctx);
	}
	else if(SynClassDefinition *node = getType<SynClassDefinition>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynClassDefinition(%.*s%s)", FMT_ISTR(node->name->name), node->extendable ? ", extendable" : "");

		PrintGraph(ctx, node->align, "align");

		PrintEnterBlock(ctx, "aliases");

		for(SynBase *arg = node->aliases.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintGraph(ctx, node->baseClass, "baseClass");
		PrintGraph(ctx, node->elements, "elements");

		PrintLeaveBlock(ctx);
	}
	else if(SynEnumDefinition *node = getType<SynEnumDefinition>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynEnumDefinition(%.*s)", FMT_ISTR(node->name->name));

		for(SynBase *arg = node->values.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);
	}
	else if(SynNamespaceDefinition *node = getType<SynNamespaceDefinition>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynNamespaceDefinition()");

		PrintEnterBlock(ctx, "path");

		for(SynIdentifier *part = node->path.head; part; part = getType<SynIdentifier>(part->next))
			PrintGraph(ctx, part, "");

		PrintLeaveBlock(ctx);

		PrintEnterBlock(ctx, "expressions");

		for(SynBase *arg = node->expressions.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);
	}
	else if(SynModuleImport *node = getType<SynModuleImport>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynModuleImport()");

		for(SynIdentifier *part = node->path.head; part; part = getType<SynIdentifier>(part->next))
			PrintGraph(ctx, part, "");

		PrintLeaveBlock(ctx);
	}
	else if(SynModule *node = getType<SynModule>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynModule()");

		PrintEnterBlock(ctx, "imports");

		for(SynModuleImport *import = node->imports.head; import; import = getType<SynModuleImport>(import->next))
			PrintGraph(ctx, import, "");

		PrintLeaveBlock(ctx);

		PrintEnterBlock(ctx, "expressions");

		for(SynBase *expr = node->expressions.head; expr; expr = expr->next)
			PrintGraph(ctx, expr, "");

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);

		ctx.output.Flush();
	}
	else if(!syntax)
	{
		PrintIndented(ctx, name, "null");
	}
	else
	{
		assert(!"unknown type");
	}
}